

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O0

void __thiscall bgui::ImageWindow::onMousePressed(ImageWindow *this,Button b,int x,int y,int state)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int in_ECX;
  int iVar4;
  int iVar5;
  BaseWindow *this_00;
  char *text;
  int in_EDX;
  undefined4 in_ESI;
  BaseWindow *in_RDI;
  uint in_R8D;
  double dVar6;
  double dVar7;
  double dVar8;
  long ih;
  long iw;
  int h;
  int w;
  double yy_1;
  double xx_1;
  double s_1;
  double yy;
  double xx;
  double s;
  ImageWindow *in_stack_00000170;
  int *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  BaseWindow *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined1 force;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff2c;
  undefined2 uVar9;
  char *in_stack_ffffffffffffff30;
  BaseWindow *in_stack_ffffffffffffff38;
  int local_a0;
  int local_9c;
  double local_88;
  double local_70;
  string local_68 [48];
  string local_38 [36];
  int local_14;
  int local_10;
  
  force = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  uVar9 = (undefined2)((uint)in_stack_ffffffffffffff2c >> 0x10);
  local_14 = in_ECX;
  local_10 = in_EDX;
  switch(in_ESI) {
  case 0:
    *(int *)((long)&in_RDI[4].p + 4) = in_EDX + *(int *)((long)&in_RDI[4]._vptr_BaseWindow + 4);
    *(int *)&in_RDI[5]._vptr_BaseWindow = in_ECX + *(int *)&in_RDI[4].p;
    if ((((in_R8D & 0x20) != 0) && (in_RDI[1]._vptr_BaseWindow != (_func_int **)0x0)) &&
       (-1 < *(int *)((long)&in_RDI[4].p + 4))) {
      this_00 = (BaseWindow *)(long)*(int *)((long)&in_RDI[4].p + 4);
      lVar1 = (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x58))();
      if (((long)this_00 < lVar1) && (-1 < *(int *)&in_RDI[5]._vptr_BaseWindow)) {
        text = (char *)(long)*(int *)&in_RDI[5]._vptr_BaseWindow;
        lVar1 = (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x60))();
        if ((long)text < lVar1) {
          *(undefined1 *)((long)&in_RDI[5]._vptr_BaseWindow + 4) = 0;
          (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x50))
                    (local_38,in_RDI[1]._vptr_BaseWindow,(long)*(int *)((long)&in_RDI[4].p + 4),
                     (long)*(int *)&in_RDI[5]._vptr_BaseWindow);
          std::__cxx11::string::c_str();
          iVar4 = BaseWindow::getTextHeight(in_RDI);
          BaseWindow::setInfoLine
                    (this_00,text,SUB41((uint)iVar4 >> 0x18,0),SUB41((uint)iVar4 >> 0x10,0));
          std::__cxx11::string::~string(local_38);
          return;
        }
      }
    }
    updateInfo(in_stack_00000170);
    break;
  default:
    break;
  case 2:
    *(int *)((long)&in_RDI[4].p + 4) = in_EDX + *(int *)((long)&in_RDI[4]._vptr_BaseWindow + 4);
    *(int *)&in_RDI[5]._vptr_BaseWindow = in_ECX + *(int *)&in_RDI[4].p;
    if ((((in_RDI[1]._vptr_BaseWindow != (_func_int **)0x0) &&
         (-1 < *(int *)((long)&in_RDI[4].p + 4))) &&
        (iVar4 = *(int *)((long)&in_RDI[4].p + 4),
        lVar1 = (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x58))(), iVar4 < lVar1)) &&
       ((-1 < *(int *)&in_RDI[5]._vptr_BaseWindow &&
        (iVar4 = *(int *)&in_RDI[5]._vptr_BaseWindow,
        lVar1 = (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x60))(), iVar4 < lVar1)))) {
      *(undefined1 *)((long)&in_RDI[5]._vptr_BaseWindow + 4) = 0;
      (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x50))
                (local_68,in_RDI[1]._vptr_BaseWindow,(long)*(int *)((long)&in_RDI[4].p + 4),
                 (long)*(int *)&in_RDI[5]._vptr_BaseWindow);
      std::__cxx11::string::c_str();
      BaseWindow::getTextHeight(in_RDI);
      BaseWindow::setInfoLine
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,SUB21((ushort)uVar9 >> 8,0),
                 SUB21(uVar9,0));
      std::__cxx11::string::~string(local_68);
    }
    break;
  case 3:
    BaseWindow::setInfoLine
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0),
               SUB41((uint)in_stack_ffffffffffffff2c >> 0x10,0));
    if (in_RDI[1]._vptr_BaseWindow != (_func_int **)0x0) {
      dVar7 = ImageAdapterBase::getScale((ImageAdapterBase *)in_RDI[1]._vptr_BaseWindow);
      iVar4 = local_10 + *(int *)((long)&in_RDI[4]._vptr_BaseWindow + 4);
      iVar5 = local_14 + *(int *)&in_RDI[4].p;
      dVar6 = log(1.0 / dVar7);
      dVar8 = log(2.0);
      dVar6 = floor(dVar6 / dVar8);
      local_70 = pow(2.0,dVar6);
      local_70 = 1.0 / local_70;
      dVar6 = local_70;
      dVar8 = ImageAdapterBase::getScale((ImageAdapterBase *)in_RDI[1]._vptr_BaseWindow);
      if ((dVar6 == dVar8) && (!NAN(dVar6) && !NAN(dVar8))) {
        local_70 = local_70 * 2.0;
      }
      ImageAdapterBase::setScale((ImageAdapterBase *)in_RDI[1]._vptr_BaseWindow,local_70);
      *(int *)((long)&in_RDI[4]._vptr_BaseWindow + 4) =
           (int)(long)(((double)iVar4 / dVar7) * local_70 + -(double)local_10);
      *(int *)&in_RDI[4].p = (int)(long)(((double)iVar5 / dVar7) * local_70 + -(double)local_14);
      redrawImage((ImageWindow *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  (bool)force);
      updateInfo(in_stack_00000170);
    }
    break;
  case 4:
    if (in_RDI[1]._vptr_BaseWindow != (_func_int **)0x0) {
      dVar6 = ImageAdapterBase::getScale((ImageAdapterBase *)in_RDI[1]._vptr_BaseWindow);
      iVar4 = local_10 + *(int *)((long)&in_RDI[4]._vptr_BaseWindow + 4);
      iVar5 = local_14 + *(int *)&in_RDI[4].p;
      ImageAdapterBase::setScale((ImageAdapterBase *)in_RDI[1]._vptr_BaseWindow,1.0);
      lVar1 = (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x58))();
      lVar2 = (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x60))();
      BaseWindow::getSize(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                          in_stack_fffffffffffffee0);
      dVar7 = log(1.0 / dVar6);
      dVar8 = log(2.0);
      dVar7 = floor(dVar7 / dVar8 + 1e-06);
      dVar7 = pow(2.0,dVar7);
      local_88 = (1.0 / dVar7) / 2.0;
      ImageAdapterBase::setScale((ImageAdapterBase *)in_RDI[1]._vptr_BaseWindow,local_88);
      if (local_88 < 1.0) {
        lVar3 = (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x58))();
        if ((lVar3 < local_9c) &&
           (lVar3 = (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x60))(), lVar3 < local_a0)) {
          local_88 = (double)local_9c / (double)lVar1;
          ImageAdapterBase::setScale((ImageAdapterBase *)in_RDI[1]._vptr_BaseWindow,local_88);
          lVar1 = (**(code **)(*in_RDI[1]._vptr_BaseWindow + 0x60))();
          if (local_a0 < lVar1) {
            local_88 = (double)local_a0 / (double)lVar2;
            ImageAdapterBase::setScale((ImageAdapterBase *)in_RDI[1]._vptr_BaseWindow,local_88);
          }
        }
        if (1.0 < local_88) {
          local_88 = 1.0;
          ImageAdapterBase::setScale((ImageAdapterBase *)in_RDI[1]._vptr_BaseWindow,1.0);
        }
      }
      *(int *)((long)&in_RDI[4]._vptr_BaseWindow + 4) =
           (int)(long)(((double)iVar4 / dVar6) * local_88 + -(double)local_10);
      *(int *)&in_RDI[4].p = (int)(long)(((double)iVar5 / dVar6) * local_88 + -(double)local_14);
      redrawImage((ImageWindow *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  (bool)force);
      updateInfo(in_stack_00000170);
    }
  }
  return;
}

Assistant:

void ImageWindow::onMousePressed(Button b, int x, int y, int state)
{
  switch (b)
  {
    case button1:
      // store for panning

      xp=x+imx;
      yp=y+imy;

      if ((state & shiftmask) != 0 && adapt != 0 && xp >= 0 &&
          xp < adapt->getWidth() && yp >= 0 && yp < adapt->getHeight())
      {
        showinfo=false;
        setInfoLine(adapt->getDescriptionOfPixel(xp, yp).c_str(), y > getTextHeight());
      }
      else
      {
        updateInfo();
      }

      break;

    case button3:
      xp=x+imx;
      yp=y+imy;

      if (adapt != 0 && xp >= 0 && xp < adapt->getWidth() && yp >= 0 &&
          yp < adapt->getHeight())
      {
        showinfo=false;
        setInfoLine(adapt->getDescriptionOfPixel(xp, yp).c_str(), y > getTextHeight());
      }

      break;

    case button4:
      setInfoLine("");

      if (adapt != 0)
      {
        double s=adapt->getScale();
        double xx=(x+imx)/s;
        double yy=(y+imy)/s;

        s=1.0/pow(2.0, floor(log(1.0/s)/log(2.0)));

        if (s == adapt->getScale())
        {
          s*=2;
        }

        adapt->setScale(s);

        imx=static_cast<long>(xx*s-x);
        imy=static_cast<long>(yy*s-y);

        redrawImage();
        updateInfo();
      }

      break;

    case button5:
      if (adapt != 0)
      {
        double s=adapt->getScale();
        double xx=(x+imx)/s;
        double yy=(y+imy)/s;
        int    w, h;
        long   iw, ih;

        adapt->setScale(1.0);
        iw=adapt->getWidth();
        ih=adapt->getHeight();

        getSize(w, h);

        s=1.0/pow(2.0, floor(log(1.0/s)/log(2.0)+1e-6));

        s/=2;

        adapt->setScale(s);

        if (s < 1)
        {
          if (adapt->getWidth() < w && adapt->getHeight() < h)
          {
            s=static_cast<double>(w)/iw;
            adapt->setScale(s);

            if (adapt->getHeight() > h)
            {
              s=static_cast<double>(h)/ih;
              adapt->setScale(s);
            }
          }

          if (s > 1)
          {
            s=1;
            adapt->setScale(s);
          }
        }

        imx=static_cast<long>(xx*s-x);
        imy=static_cast<long>(yy*s-y);

        redrawImage();
        updateInfo();
      }

      break;

    default:
      break;
  }
}